

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

uint64_t to_msr_pl_default(double watts,double power_units)

{
  ulong local_20;
  uint64_t bits;
  double power_units_local;
  double watts_local;
  
  if (watts < 0.0) {
    __assert_fail("watts >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x5b,"uint64_t to_msr_pl_default(double, double)");
  }
  if (0.0 < power_units) {
    local_20 = (ulong)(watts / power_units);
    local_20 = local_20 |
               (long)(watts / power_units - 9.223372036854776e+18) & (long)local_20 >> 0x3f;
    if (0x7fff < local_20) {
      fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
      fprintf(_stderr,"Power limit too large: %.12f W, using max: %.12f W\n",watts,
              power_units * 32767.0);
      local_20 = 0x7fff;
    }
    return local_20;
  }
  __assert_fail("power_units > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x5c,"uint64_t to_msr_pl_default(double, double)");
}

Assistant:

static uint64_t to_msr_pl_default(double watts, double power_units) {
  assert(watts >= 0);
  assert(power_units > 0);
  // Lower bound is 0, but upper bound is limited by what fits in 15 bits
  static const uint64_t MSR_POWER_MAX = 0x7FFF;
  uint64_t bits = (uint64_t) (watts / power_units);
  if (bits > MSR_POWER_MAX) {
    raplcap_log(WARN, "Power limit too large: %.12f W, using max: %.12f W\n", watts, MSR_POWER_MAX * power_units);
    bits = MSR_POWER_MAX;
  }
  raplcap_log(DEBUG, "to_msr_pl_default: watts=%.12f, power_units=%.12f, bits=0x%04lX\n", watts, power_units, bits);
  return bits;
}